

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpalette_p.h
# Opt level: O1

void __thiscall QPalettePrivate::Data::Data(Data *this,Data *other)

{
  int iVar1;
  undefined1 *puVar2;
  long lVar3;
  undefined1 *puVar4;
  int grp;
  long lVar5;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  lVar5 = 8;
  do {
    QBrush::QBrush((QBrush *)
                   ((long)&(this->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                   lVar5));
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x218);
  iVar1 = qt_palette_count + 1;
  this->ser_no = qt_palette_count;
  qt_palette_count = iVar1;
  puVar4 = &this->field_0x8;
  puVar2 = &other->field_0x8;
  lVar5 = 0;
  do {
    lVar3 = 0;
    do {
      QBrush::operator=((QBrush *)(puVar4 + lVar3),(QBrush *)(puVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0xb0);
    lVar5 = lVar5 + 1;
    puVar2 = puVar2 + 0xb0;
    puVar4 = puVar4 + 0xb0;
  } while (lVar5 != 3);
  return;
}

Assistant:

Data(const Data &other)
            : QSharedData(other)
        {
            for (int grp = 0; grp < int(QPalette::NColorGroups); grp++) {
                for (int role = 0; role < int(QPalette::NColorRoles); role++)
                    br[grp][role] = other.br[grp][role];
            }
        }